

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_hrec_add_key(bcf_hrec_t *hrec,char *str,int len)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  int n;
  int len_local;
  char *str_local;
  bcf_hrec_t *hrec_local;
  
  iVar1 = hrec->nkeys;
  iVar2 = iVar1 + 1;
  hrec->nkeys = iVar2;
  ppcVar3 = (char **)realloc(hrec->keys,(long)iVar2 << 3);
  hrec->keys = ppcVar3;
  ppcVar3 = (char **)realloc(hrec->vals,(long)iVar2 << 3);
  hrec->vals = ppcVar3;
  if (len != 0) {
    pcVar4 = (char *)malloc((long)(len + 1));
    hrec->keys[iVar1] = pcVar4;
    memcpy(hrec->keys[iVar1],str,(long)len);
    hrec->keys[iVar1][len] = '\0';
    hrec->vals[iVar1] = (char *)0x0;
    return;
  }
  __assert_fail("len",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                ,0xdd,"void bcf_hrec_add_key(bcf_hrec_t *, const char *, int)");
}

Assistant:

void bcf_hrec_add_key(bcf_hrec_t *hrec, const char *str, int len)
{
    int n = ++hrec->nkeys;
    hrec->keys = (char**) realloc(hrec->keys, sizeof(char*)*n);
    hrec->vals = (char**) realloc(hrec->vals, sizeof(char*)*n);
    assert( len );
    hrec->keys[n-1] = (char*) malloc((len+1)*sizeof(char));
    memcpy(hrec->keys[n-1],str,len);
    hrec->keys[n-1][len] = 0;
    hrec->vals[n-1] = NULL;
}